

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

char * ssh2_pkt_type(Pkt_KCtx pkt_kctx,Pkt_ACtx pkt_actx,int type)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  undefined **ppuVar4;
  Pkt_ACtx PVar5;
  uint uVar6;
  Pkt_KCtx PVar7;
  
  uVar1 = type - 1;
  if ((uVar1 < 0x15) && ((0x18007fU >> (uVar1 & 0x1f) & 1) != 0)) {
    uVar2 = (ulong)uVar1;
    ppuVar4 = &PTR_anon_var_dwarf_1fd17_001a6a30;
  }
  else {
    uVar1 = type ^ 0x1e;
    if ((pkt_kctx ^ SSH2_PKTCTX_DHGROUP) == SSH2_PKTCTX_NOKEX && uVar1 == 0) {
      return "SSH2_MSG_KEXDH_INIT";
    }
    uVar3 = type ^ 0x1f;
    if ((pkt_kctx ^ SSH2_PKTCTX_DHGROUP) == SSH2_PKTCTX_NOKEX && uVar3 == 0) {
      return "SSH2_MSG_KEXDH_REPLY";
    }
    PVar7 = pkt_kctx ^ SSH2_PKTCTX_DHGEX;
    if (PVar7 == SSH2_PKTCTX_NOKEX && uVar1 == 0) {
      return "SSH2_MSG_KEX_DH_GEX_REQUEST_OLD";
    }
    if (PVar7 == SSH2_PKTCTX_NOKEX && (type ^ 0x22U) == 0) {
      return "SSH2_MSG_KEX_DH_GEX_REQUEST";
    }
    if (PVar7 == SSH2_PKTCTX_NOKEX && uVar3 == 0) {
      return "SSH2_MSG_KEX_DH_GEX_GROUP";
    }
    uVar6 = type ^ 0x20;
    if (PVar7 == SSH2_PKTCTX_NOKEX && uVar6 == 0) {
      return "SSH2_MSG_KEX_DH_GEX_INIT";
    }
    if (PVar7 == SSH2_PKTCTX_NOKEX && (type ^ 0x21U) == 0) {
      return "SSH2_MSG_KEX_DH_GEX_REPLY";
    }
    PVar7 = pkt_kctx ^ SSH2_PKTCTX_GSSKEX;
    if (PVar7 == SSH2_PKTCTX_NOKEX && uVar1 == 0) {
      return "SSH2_MSG_KEXGSS_INIT";
    }
    if (PVar7 == SSH2_PKTCTX_NOKEX && uVar3 == 0) {
      return "SSH2_MSG_KEXGSS_CONTINUE";
    }
    if (PVar7 == SSH2_PKTCTX_NOKEX && uVar6 == 0) {
      return "SSH2_MSG_KEXGSS_COMPLETE";
    }
    if ((type ^ 0x21U) == 0 && PVar7 == SSH2_PKTCTX_NOKEX) {
      return "SSH2_MSG_KEXGSS_HOSTKEY";
    }
    if ((type ^ 0x22U) == 0 && PVar7 == SSH2_PKTCTX_NOKEX) {
      return "SSH2_MSG_KEXGSS_ERROR";
    }
    if (type == 0x28 && PVar7 == SSH2_PKTCTX_NOKEX) {
      return "SSH2_MSG_KEXGSS_GROUPREQ";
    }
    if (PVar7 == SSH2_PKTCTX_NOKEX && type == 0x29) {
      return "SSH2_MSG_KEXGSS_GROUP";
    }
    PVar7 = pkt_kctx ^ SSH2_PKTCTX_RSAKEX;
    if (PVar7 == SSH2_PKTCTX_NOKEX && uVar1 == 0) {
      return "SSH2_MSG_KEXRSA_PUBKEY";
    }
    if (PVar7 == SSH2_PKTCTX_NOKEX && uVar3 == 0) {
      return "SSH2_MSG_KEXRSA_SECRET";
    }
    if (PVar7 == SSH2_PKTCTX_NOKEX && uVar6 == 0) {
      return "SSH2_MSG_KEXRSA_DONE";
    }
    if (uVar1 == 0 && (pkt_kctx ^ SSH2_PKTCTX_ECDHKEX) == SSH2_PKTCTX_NOKEX) {
      return "SSH2_MSG_KEX_ECDH_INIT";
    }
    if ((pkt_kctx ^ SSH2_PKTCTX_ECDHKEX) == SSH2_PKTCTX_NOKEX && uVar3 == 0) {
      return "SSH2_MSG_KEX_ECDH_REPLY";
    }
    if (type - 0x32U < 4) {
      uVar2 = (ulong)(type - 0x32U);
      ppuVar4 = &PTR_anon_var_dwarf_1fe7e_001a6ad8;
    }
    else {
      uVar1 = type ^ 0x3c;
      if (pkt_actx == SSH2_PKTCTX_PUBLICKEY && uVar1 == 0) {
        return "SSH2_MSG_USERAUTH_PK_OK";
      }
      if (pkt_actx == SSH2_PKTCTX_PASSWORD && uVar1 == 0) {
        return "SSH2_MSG_USERAUTH_PASSWD_CHANGEREQ";
      }
      if ((pkt_actx ^ SSH2_PKTCTX_KBDINTER) == SSH2_PKTCTX_NOAUTH && uVar1 == 0) {
        return "SSH2_MSG_USERAUTH_INFO_REQUEST";
      }
      if ((pkt_actx ^ SSH2_PKTCTX_KBDINTER) == SSH2_PKTCTX_NOAUTH && (type ^ 0x3dU) == 0) {
        return "SSH2_MSG_USERAUTH_INFO_RESPONSE";
      }
      PVar5 = pkt_actx ^ SSH2_PKTCTX_GSSAPI;
      if (uVar1 == 0 && PVar5 == SSH2_PKTCTX_NOAUTH) {
        return "SSH2_MSG_USERAUTH_GSSAPI_RESPONSE";
      }
      if ((type ^ 0x3dU) == 0 && PVar5 == SSH2_PKTCTX_NOAUTH) {
        return "SSH2_MSG_USERAUTH_GSSAPI_TOKEN";
      }
      if (type == 0x3f && PVar5 == SSH2_PKTCTX_NOAUTH) {
        return "SSH2_MSG_USERAUTH_GSSAPI_EXCHANGE_COMPLETE";
      }
      if (type == 0x40 && PVar5 == SSH2_PKTCTX_NOAUTH) {
        return "SSH2_MSG_USERAUTH_GSSAPI_ERROR";
      }
      if (type == 0x41 && PVar5 == SSH2_PKTCTX_NOAUTH) {
        return "SSH2_MSG_USERAUTH_GSSAPI_ERRTOK";
      }
      if (PVar5 == SSH2_PKTCTX_NOAUTH && type == 0x42) {
        return "SSH2_MSG_USERAUTH_GSSAPI_MIC";
      }
      if (0x14 < type - 0x50U) {
        return "unknown";
      }
      uVar2 = (ulong)(type - 0x50U);
      ppuVar4 = &PTR_anon_var_dwarf_1ff3e_001a6af8;
    }
  }
  return ppuVar4[uVar2];
}

Assistant:

const char *ssh2_pkt_type(Pkt_KCtx pkt_kctx, Pkt_ACtx pkt_actx, int type)
{
    SSH2_MESSAGE_TYPES(TRANSLATE_UNIVERSAL, TRANSLATE_KEX, TRANSLATE_AUTH, y);
    return "unknown";
}